

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_handle.cpp
# Opt level: O1

void __thiscall
duckdb::BufferHandle::BufferHandle
          (BufferHandle *this,shared_ptr<duckdb::BlockHandle,_true> *handle_p,
          optional_ptr<duckdb::FileBuffer,_true> node_p)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->handle).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (handle_p->internal).super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (handle_p->internal).super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (handle_p->internal).super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->handle).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar1;
  (this->handle).internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (handle_p->internal).super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->node).ptr = node_p.ptr;
  return;
}

Assistant:

BufferHandle::BufferHandle(shared_ptr<BlockHandle> handle_p, optional_ptr<FileBuffer> node_p)
    : handle(std::move(handle_p)), node(node_p) {
}